

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

int os_is_file_in_dir(char *filename,char *path,int allow_subdirs,int match_self)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  char *path_00;
  char *path_01;
  char *__s;
  char *pcVar5;
  char *pcVar6;
  char filename_buf [4096];
  char path_buf [4096];
  char local_2038 [4095];
  char acStack_1039 [4105];
  
  pcVar6 = local_2038;
  iVar2 = os_is_file_absolute(filename);
  if (iVar2 == 0) {
    os_get_abs_filename(local_2038,0x1000,filename);
    filename = local_2038;
  }
  iVar2 = os_is_file_absolute(path);
  pcVar5 = acStack_1039 + 1;
  if (iVar2 == 0) {
    os_get_abs_filename(pcVar5,0x1000,path);
    path = pcVar5;
  }
  if (local_2038 != filename) {
    __s = "";
    if (filename != (char *)0x0) {
      __s = filename;
    }
    sVar3 = strlen(__s);
    sVar4 = 0xfff;
    if (sVar3 < 0xfff) {
      sVar4 = sVar3;
    }
    memcpy(local_2038,__s,sVar4);
    local_2038[sVar4] = '\0';
  }
  canonicalize_path(local_2038);
  resolve_path(local_2038,(size_t)local_2038,path_00);
  if (pcVar5 != path) {
    pcVar5 = "";
    if (path != (char *)0x0) {
      pcVar5 = path;
    }
    sVar3 = strlen(pcVar5);
    sVar4 = 0xfff;
    if (sVar3 < 0xfff) {
      sVar4 = sVar3;
    }
    memcpy(acStack_1039 + 1,pcVar5,sVar4);
    acStack_1039[sVar4 + 1] = '\0';
  }
  pcVar5 = acStack_1039 + 1;
  canonicalize_path(pcVar5);
  resolve_path(pcVar5,(size_t)pcVar5,path_01);
  sVar4 = strlen(local_2038);
  sVar3 = strlen(pcVar5);
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = sVar3 - (acStack_1039[sVar3] == '/');
  }
  if ((sVar3 != sVar4) || (iVar2 = bcmp(local_2038,acStack_1039 + 1,sVar4), iVar2 != 0)) {
    match_self = 0;
    if ((sVar3 + 2 <= sVar4) &&
       (((iVar2 = bcmp(local_2038,acStack_1039 + 1,sVar3), match_self = 0, iVar2 == 0 &&
         (local_2038[sVar3] == '/')) && (match_self = 1, allow_subdirs == 0)))) {
      for (; (cVar1 = *pcVar6, cVar1 != '\0' && (cVar1 != '/')); pcVar6 = pcVar6 + 1) {
      }
      match_self = (int)(cVar1 == '\0');
    }
  }
  return match_self;
}

Assistant:

int
os_is_file_in_dir( const char* filename, const char* path,
                   int allow_subdirs, int match_self )
{
    char filename_buf[OSFNMAX], path_buf[OSFNMAX];
    size_t flen, plen;

    // Absolute-ize the filename, if necessary.
    if (not os_is_file_absolute(filename)) {
        os_get_abs_filename(filename_buf, sizeof(filename_buf), filename);
        filename = filename_buf;
    }

    // Absolute-ize the path, if necessary.
    if (not os_is_file_absolute(path)) {
        os_get_abs_filename(path_buf, sizeof(path_buf), path);
        path = path_buf;
    }

    // Canonicalize the paths, to remove .. and . elements - this will make
    // it possible to directly compare the path strings.  Also resolve it
    // to the extent possible, to make sure we're not fooled by symbolic
    // links.
    safe_strcpy(filename_buf, sizeof(filename_buf), filename);
    canonicalize_path(filename_buf);
    resolve_path(filename_buf, sizeof(filename_buf), filename_buf);
    filename = filename_buf;

    safe_strcpy(path_buf, sizeof(path_buf), path);
    canonicalize_path(path_buf);
    resolve_path(path_buf, sizeof(path_buf), path_buf);
    path = path_buf;

    // Get the length of the filename and the length of the path.
    flen = strlen(filename);
    plen = strlen(path);

    // If the path ends in a separator character, ignore that.
    if (plen > 0 and path[plen-1] == '/')
        --plen;

    // if the names match, return true if and only if we're matching the
    // directory to itself
    if (plen == flen && memcmp(filename, path, flen) == 0)
        return match_self;

    // Check that the filename has 'path' as its path prefix.  First, check
    // that the leading substring of the filename matches 'path', ignoring
    // case.  Note that we need the filename to be at least two characters
    // longer than the path: it must have a path separator after the path
    // name, and at least one character for a filename past that.
    if (flen < plen + 2 or memcmp(filename, path, plen) != 0)
        return false;

    // Okay, 'path' is the leading substring of 'filename'; next make sure
    // that this prefix actually ends at a path separator character in the
    // filename.  (This is necessary so that we don't confuse "c:\a\b.txt"
    // as matching "c:\abc\d.txt" - if we only matched the "c:\a" prefix,
    // we'd miss the fact that the file is actually in directory "c:\abc",
    // not "c:\a".)
    if (filename[plen] != '/')
        return false;

    // We're good on the path prefix - we definitely have a file that's
    // within the 'path' directory or one of its subdirectories.  If we're
    // allowed to match on subdirectories, we already have our answer
    // (true).  If we're not allowed to match subdirectories, we still have
    // one more check, which is that the rest of the filename is free of
    // path separator charactres.  If it is, we have a file that's directly
    // in the 'path' directory; otherwise it's in a subdirectory of 'path'
    // and thus isn't a match.
    if (allow_subdirs) {
        // Filename is in the 'path' directory or one of its
        // subdirectories, and we're allowed to match on subdirectories, so
        // we have a match.
        return true;
    }

    // We're not allowed to match subdirectories, so scan the rest of
    // the filename for path separators.  If we find any, the file is
    // in a subdirectory of 'path' rather than directly in 'path'
    // itself, so it's not a match.  If we don't find any separators,
    // we have a file directly in 'path', so it's a match.
    const char* p;
    for (p = filename; *p != '\0' and *p != '/' ; ++p)
        ;

    // If we reached the end of the string without finding a path
    // separator character, it's a match .
    return *p == '\0';
}